

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

bool __thiscall w3Module::read_mutable(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  allocator<char> local_31;
  string local_30;
  
  bVar1 = read_byte(this,cursor);
  if (1 < bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"invalid mutable",&local_31);
    ThrowString(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1 == 1;
}

Assistant:

bool w3Module::read_mutable (uint8_t** cursor)
{
    const uint32_t m = read_byte (cursor);
    switch (m)
    {
    case 0:
    case 1: break;
    default:
        ThrowString ("invalid mutable");
    }
    return m == 1;
}